

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TryExpr::TryExpr(TryExpr *this,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined ***)this = &PTR__Expr_001e39e8;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  *(size_t *)&this->field_0x18 = (loc->filename)._M_len;
  *(char **)&this->field_0x20 = pcVar1;
  *(size_t *)&this->field_0x28 = sVar2;
  *(undefined8 *)&this->field_0x30 = uVar3;
  *(undefined8 *)&this->field_0x38 = 0x3d;
  *(undefined ***)this = &PTR__TryExpr_001e4b90;
  Block::Block(&this->block);
  (this->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Var::Var(&this->delegate_target);
  return;
}

Assistant:

explicit TryExpr(const Location& loc = Location())
      : ExprMixin<ExprType::Try>(loc), kind(TryKind::Plain) {}